

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::
TestParsingMergeLite_RepeatedFieldsGenerator
          (TestParsingMergeLite_RepeatedFieldsGenerator *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = (intptr_t)arena;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__TestParsingMergeLite_RepeatedFieldsGenerator_0053b5a0;
  Impl_::Impl_((Impl_ *)&this->field_0);
  return;
}

Assistant:

explicit InternalMetadata(Arena* arena) {
    ptr_ = reinterpret_cast<intptr_t>(arena);
  }